

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadMemorySection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  uint local_54;
  undefined1 local_50 [4];
  uint32_t page_size;
  Limits page_limits;
  Index memory_index;
  Index i;
  uint local_28;
  Enum local_24;
  Index num_memories;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _num_memories = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x20])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (bVar1) {
    RVar2 = ReadCount(this,&local_28,"memory count");
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x21])();
      bVar1 = Succeeded(RVar2);
      if (bVar1) {
        for (page_limits._20_4_ = 0; (uint)page_limits._20_4_ < local_28;
            page_limits._20_4_ = page_limits._20_4_ + 1) {
          page_limits._16_4_ = this->num_memory_imports_ + page_limits._20_4_;
          Limits::Limits((Limits *)local_50);
          RVar2 = ReadMemory(this,(Limits *)local_50,&local_54);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x22])
                                  (this->delegate_,(ulong)(uint)page_limits._16_4_,local_50,
                                   (ulong)local_54);
          bVar1 = Succeeded(RVar2);
          if (!bVar1) {
            PrintError(this,"OnMemory callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x23])();
        bVar1 = Succeeded(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndMemorySection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnMemoryCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginMemorySection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadMemorySection(Offset section_size) {
  CALLBACK(BeginMemorySection, section_size);
  Index num_memories;
  CHECK_RESULT(ReadCount(&num_memories, "memory count"));
  CALLBACK(OnMemoryCount, num_memories);
  for (Index i = 0; i < num_memories; ++i) {
    Index memory_index = num_memory_imports_ + i;
    Limits page_limits;
    uint32_t page_size;
    CHECK_RESULT(ReadMemory(&page_limits, &page_size));
    CALLBACK(OnMemory, memory_index, &page_limits, page_size);
  }
  CALLBACK0(EndMemorySection);
  return Result::Ok;
}